

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

Symbol * __thiscall
anon_unknown.dwarf_f4258f::InstanceBuilder::create
          (InstanceBuilder *this,HierarchicalInstanceSyntax *syntax)

{
  SourceRange sourceRange;
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  group_type *pgVar4;
  pointer ppVar5;
  SyntaxNode *in_RSI;
  SyntaxNode *in_RDI;
  SyntaxList<slang::syntax::VariableDimensionSyntax> dims;
  HierarchyOverrideNode *in_stack_000000a8;
  HierarchicalInstanceSyntax *in_stack_000000b0;
  InstanceBuilder *in_stack_000000b8;
  const_iterator sit;
  HierarchyOverrideNode *overrideNode;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_stack_fffffffffffffdf8;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_stack_fffffffffffffe00;
  group15<boost::unordered::detail::foa::plain_integral> *in_stack_fffffffffffffe08;
  span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *this_00;
  ASTContext *in_stack_fffffffffffffe18;
  SourceLocation in_stack_fffffffffffffe20;
  SyntaxNode *pSVar6;
  SourceLocation in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  DiagCode code;
  SyntaxNode *local_1c8;
  HierarchyOverrideNode *in_stack_fffffffffffffe70;
  HierarchicalInstanceSyntax *in_stack_fffffffffffffe78;
  InstanceBuilder *in_stack_fffffffffffffe80;
  Entry local_150;
  char_pointer local_148;
  table_element_pointer local_140;
  span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *local_138;
  SourceRange local_130;
  undefined4 local_11e;
  undefined1 local_119;
  SyntaxNode *local_118;
  Symbol *local_108;
  Entry *local_100;
  SyntaxNode *local_f8;
  char_pointer local_f0;
  table_element_pointer local_e8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_e0;
  Entry *local_d0;
  SyntaxNode *local_c8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>
  local_b0;
  Entry *local_98;
  SyntaxNode *local_90;
  iterator local_88;
  size_t local_78;
  Entry *local_70;
  SyntaxNode *local_68;
  uint local_5c;
  value_type *local_58;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  NetType *in_stack_ffffffffffffffc0;
  ASTContext *in_stack_ffffffffffffffc8;
  HierarchicalInstanceSyntax *in_stack_ffffffffffffffd0;
  bitmask<slang::ast::InstanceFlags> in_stack_ffffffffffffffdf;
  
  code = SUB84((ulong)in_stack_fffffffffffffe30 >> 0x20,0);
  local_119 = *(undefined1 *)&in_RDI[0xe].previewNode;
  local_118 = in_RSI;
  createImplicitNets(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffdf,
                     (SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                      *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     in_stack_ffffffffffffffb0);
  slang::SmallVectorBase<unsigned_int>::clear
            ((SmallVectorBase<unsigned_int> *)in_stack_fffffffffffffe00);
  if (*(long *)(local_118 + 1) == 0) {
    local_11e = 0x4e0006;
    local_130 = slang::syntax::SyntaxNode::sourceRange(in_RDI);
    sourceRange.endLoc = in_stack_fffffffffffffe28;
    sourceRange.startLoc = in_stack_fffffffffffffe20;
    slang::ast::ASTContext::addDiag(in_stack_fffffffffffffe18,code,sourceRange);
    local_108 = createInstance(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                               in_stack_fffffffffffffe70);
  }
  else {
    local_138 = (span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)0x0;
    if (in_RDI[9].previewNode != (SyntaxNode *)0x0) {
      pSVar6 = in_RDI[9].previewNode + 2;
      if (in_RDI[10].previewNode == (SyntaxNode *)0x0) {
        local_1c8 = local_118;
      }
      else {
        local_1c8 = in_RDI[10].previewNode;
      }
      slang::ast::OpaqueInstancePath::Entry::Entry(&local_150,local_1c8);
      local_100 = &local_150;
      local_f8 = pSVar6;
      local_d0 = local_100;
      local_c8 = pSVar6;
      local_98 = local_100;
      local_90 = pSVar6;
      local_70 = local_100;
      local_68 = pSVar6;
      local_78 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                 ::hash_for<slang::ast::OpaqueInstancePath::Entry>
                           ((table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                             *)in_stack_fffffffffffffe00,(Entry *)in_stack_fffffffffffffdf8);
      sVar3 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
              ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                              *)in_stack_fffffffffffffe00,(size_t)in_stack_fffffffffffffdf8);
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                ((pow2_quadratic_prober *)&stack0xffffffffffffffd0,sVar3);
      do {
        sVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::get
                          ((pow2_quadratic_prober *)&stack0xffffffffffffffd0);
        pgVar4 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                 ::groups((table_arrays<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                           *)0x6f3bff);
        pgVar4 = pgVar4 + sVar3;
        uVar2 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match
                          (in_stack_fffffffffffffe08,(size_t)in_stack_fffffffffffffe00);
        if (uVar2 != 0) {
          local_58 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                     ::elements((table_arrays<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                                 *)0x6f3c4a);
          local_58 = local_58 + sVar3 * 0xf;
          do {
            local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
            ::pred((table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                    *)0x6f3c9a);
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
            ::
            key_from<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>
                      ((pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>
                        *)0x6f3cc7);
            bVar1 = std::equal_to<slang::ast::OpaqueInstancePath::Entry>::operator()
                              ((equal_to<slang::ast::OpaqueInstancePath::Entry> *)
                               in_stack_fffffffffffffe00,(Entry *)in_stack_fffffffffffffdf8,
                               (Entry *)0x6f3cd9);
            if (bVar1) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>
              ::table_locator(&local_b0,pgVar4,local_5c,local_58 + local_5c);
              goto LAB_006f3dbb;
            }
            uVar2 = uVar2 - 1 & uVar2;
          } while (uVar2 != 0);
        }
        bVar1 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffffe00,(size_t)in_stack_fffffffffffffdf8);
        if (bVar1) {
          memset(&local_b0,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>
          ::table_locator(&local_b0);
          goto LAB_006f3dbb;
        }
        bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          ((pow2_quadratic_prober *)&stack0xffffffffffffffd0,(size_t)pSVar6->parent)
        ;
      } while (bVar1);
      memset(&local_b0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>
      ::table_locator(&local_b0);
LAB_006f3dbb:
      local_88 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                 ::make_iterator((locator *)0x6f3dc8);
      local_e0.pc_ = local_88.pc_;
      local_e0.p_ = local_88.p_;
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
      ::table_iterator<false,_nullptr>(&local_c0,&local_e0);
      local_f0 = local_c0.pc_;
      local_e8 = local_c0.p_;
      local_148 = local_c0.pc_;
      local_140 = local_c0.p_;
      boost::unordered::
      unordered_flat_map<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
      ::end((unordered_flat_map<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
             *)0x6f3e62);
      bVar1 = boost::unordered::detail::foa::operator!=
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)in_stack_fffffffffffffe00,
                         (table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)in_stack_fffffffffffffdf8);
      if (bVar1) {
        ppVar5 = boost::unordered::detail::foa::
                 table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                 ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                               *)in_stack_fffffffffffffe00);
        local_138 = (span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
                    &ppVar5->second;
      }
    }
    slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>::SyntaxList
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    this_00 = local_138;
    std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::begin
              ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
               in_stack_fffffffffffffdf8);
    std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::end(this_00);
    local_108 = recurse(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,(DimIterator)sit.p_,
                        (DimIterator)sit.pc_);
  }
  return local_108;
}

Assistant:

Symbol* create(const HierarchicalInstanceSyntax& syntax) {
        createImplicitNets(syntax, context, netType, flags, implicitNetNames, implicitNets);

        path.clear();

        if (!syntax.decl) {
            context.addDiag(diag::InstanceNameRequired, syntax.sourceRange());
            return createInstance(syntax, nullptr);
        }

        const HierarchyOverrideNode* overrideNode = nullptr;
        if (parentOverrideNode) {
            if (auto sit = parentOverrideNode->childNodes.find(overrideSyntax ? *overrideSyntax
                                                                              : syntax);
                sit != parentOverrideNode->childNodes.end()) {
                overrideNode = &sit->second;
            }
        }

        auto dims = syntax.decl->dimensions;
        return recurse(syntax, overrideNode, dims.begin(), dims.end());
    }